

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_roa_request.cpp
# Opt level: O2

void __thiscall
AliRoaRequest::AliRoaRequest
          (AliRoaRequest *this,string *version,string *appid,string *secret,string *url)

{
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)url);
  AliHttpRequest::AliHttpRequest(&this->super_AliHttpRequest,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_AliHttpRequest)._vptr_AliHttpRequest = (_func_int **)&PTR_CommitRequest_001b3ab0;
  (this->utc_time_)._M_dataplus._M_p = (pointer)&(this->utc_time_).field_2;
  (this->utc_time_)._M_string_length = 0;
  (this->utc_time_).field_2._M_local_buf[0] = '\0';
  (this->sign_nounce)._M_dataplus._M_p = (pointer)&(this->sign_nounce).field_2;
  (this->sign_nounce)._M_string_length = 0;
  (this->sign_nounce).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->version_,(string *)version);
  std::__cxx11::string::string((string *)&this->appid_,(string *)appid);
  std::__cxx11::string::string((string *)&this->secret_,(string *)secret);
  std::__cxx11::string::string((string *)&this->url_,(string *)url);
  return;
}

Assistant:

AliRoaRequest::AliRoaRequest(std::string version, 
                                   std::string appid,
                                   std::string secret,
                                   std::string url)
                                   : AliHttpRequest(url),
                                   version_(version),
                                   appid_(appid),
                                   secret_(secret),
                                   url_(url) {

}